

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  
  uVar2 = *(uint *)&pObj->field_0x14;
  if ((uVar2 & 0x20) != 0) {
    uVar2 = vLeaves->nSize;
    if (uVar2 == vLeaves->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vLeaves->pArray,0x80);
        }
        vLeaves->pArray = ppvVar3;
        vLeaves->nCap = 0x10;
      }
      else {
        if (vLeaves->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vLeaves->pArray,(ulong)uVar2 << 4);
        }
        vLeaves->pArray = ppvVar3;
        vLeaves->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vLeaves->pArray;
    }
    iVar1 = vLeaves->nSize;
    vLeaves->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pObj;
    uVar2 = *(uint *)&pObj->field_0x14 & 0xffffffdf;
    *(uint *)&pObj->field_0x14 = uVar2;
  }
  if ((uVar2 & 0x40) == 0) {
    *(uint *)&pObj->field_0x14 = uVar2 | 0x40;
    if ((pObj->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLut.c"
                    ,0x1c0,
                    "void Abc_NodeSuperChoiceCollect_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    Abc_NodeSuperChoiceCollect_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves,vVolume);
    Abc_NodeSuperChoiceCollect_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],vLeaves,vVolume);
    uVar2 = vVolume->nSize;
    if (uVar2 == vVolume->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vVolume->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVolume->pArray,0x80);
        }
        vVolume->pArray = ppvVar3;
        vVolume->nCap = 0x10;
      }
      else {
        if (vVolume->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVolume->pArray,(ulong)uVar2 << 4);
        }
        vVolume->pArray = ppvVar3;
        vVolume->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vVolume->pArray;
    }
    iVar1 = vVolume->nSize;
    vVolume->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pObj;
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    if ( pObj->fMarkB )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkB = 0;
    }
    if ( pObj->fMarkC )
        return;
    pObj->fMarkC = 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin0(pObj), vLeaves, vVolume );
    Abc_NodeSuperChoiceCollect_rec( Abc_ObjFanin1(pObj), vLeaves, vVolume );
    Vec_PtrPush( vVolume, pObj );
}